

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder.h
# Opt level: O3

void set_ref_ptrs(AV1_COMMON *cm,MACROBLOCKD *xd,MV_REFERENCE_FRAME ref0,MV_REFERENCE_FRAME ref1)

{
  scale_factors *psVar1;
  byte bVar2;
  
  if (ref0 < '\t') {
    bVar2 = 1;
    if ('\x01' < ref0) {
      bVar2 = ref0;
    }
    if (cm->remapped_ref_idx[bVar2 - 1] == -1) goto LAB_001e8fe6;
    psVar1 = cm->ref_scale_factors + cm->remapped_ref_idx[bVar2 - 1];
  }
  else {
LAB_001e8fe6:
    psVar1 = (scale_factors *)0x0;
  }
  xd->block_ref_scale_factors[0] = psVar1;
  if (ref1 < '\t') {
    bVar2 = 1;
    if ('\x01' < ref1) {
      bVar2 = ref1;
    }
    if (cm->remapped_ref_idx[bVar2 - 1] != -1) {
      psVar1 = cm->ref_scale_factors + cm->remapped_ref_idx[bVar2 - 1];
      goto LAB_001e9026;
    }
  }
  psVar1 = (scale_factors *)0x0;
LAB_001e9026:
  xd->block_ref_scale_factors[1] = psVar1;
  return;
}

Assistant:

static inline void set_ref_ptrs(const AV1_COMMON *cm, MACROBLOCKD *xd,
                                MV_REFERENCE_FRAME ref0,
                                MV_REFERENCE_FRAME ref1) {
  xd->block_ref_scale_factors[0] =
      get_ref_scale_factors_const(cm, ref0 >= LAST_FRAME ? ref0 : 1);
  xd->block_ref_scale_factors[1] =
      get_ref_scale_factors_const(cm, ref1 >= LAST_FRAME ? ref1 : 1);
}